

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_matrix.h
# Opt level: O0

_matrix<float> * __thiscall
xray_re::_matrix<float>::mul_43(_matrix<float> *this,_matrix<float> *a,_matrix<float> *b)

{
  _matrix<float> *b_local;
  _matrix<float> *a_local;
  _matrix<float> *this_local;
  
  if (this == a || this == b) {
    __assert_fail("this != &a && this != &b",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_matrix.h"
                  ,0xf0,
                  "_matrix<T> &xray_re::_matrix<float>::mul_43(const _matrix<T> &, const _matrix<T> &) [T = float]"
                 );
  }
  (this->field_0).field_0._11 =
       (a->field_0).field_0._31 * (b->field_0).field_0._13 +
       (a->field_0).field_0._11 * (b->field_0).field_0._11 +
       (a->field_0).field_0._21 * (b->field_0).field_0._12;
  (this->field_0).field_0._12 =
       (a->field_0).field_0._32 * (b->field_0).field_0._13 +
       (a->field_0).field_0._12 * (b->field_0).field_0._11 +
       (a->field_0).field_0._22 * (b->field_0).field_0._12;
  (this->field_0).field_0._13 =
       (a->field_0).field_0._33 * (b->field_0).field_0._13 +
       (a->field_0).field_0._13 * (b->field_0).field_0._11 +
       (a->field_0).field_0._23 * (b->field_0).field_0._12;
  (this->field_0).field_0._14 = 0.0;
  (this->field_0).field_0._21 =
       (a->field_0).field_0._31 * (b->field_0).field_0._23 +
       (a->field_0).field_0._11 * (b->field_0).field_0._21 +
       (a->field_0).field_0._21 * (b->field_0).field_0._22;
  (this->field_0).field_0._22 =
       (a->field_0).field_0._32 * (b->field_0).field_0._23 +
       (a->field_0).field_0._12 * (b->field_0).field_0._21 +
       (a->field_0).field_0._22 * (b->field_0).field_0._22;
  (this->field_0).field_0._23 =
       (a->field_0).field_0._33 * (b->field_0).field_0._23 +
       (a->field_0).field_0._13 * (b->field_0).field_0._21 +
       (a->field_0).field_0._23 * (b->field_0).field_0._22;
  (this->field_0).field_0._24 = 0.0;
  (this->field_0).field_0._31 =
       (a->field_0).field_0._31 * (b->field_0).field_0._33 +
       (a->field_0).field_0._11 * (b->field_0).field_0._31 +
       (a->field_0).field_0._21 * (b->field_0).field_0._32;
  (this->field_0).field_0._32 =
       (a->field_0).field_0._32 * (b->field_0).field_0._33 +
       (a->field_0).field_0._12 * (b->field_0).field_0._31 +
       (a->field_0).field_0._22 * (b->field_0).field_0._32;
  (this->field_0).field_0._33 =
       (a->field_0).field_0._33 * (b->field_0).field_0._33 +
       (a->field_0).field_0._13 * (b->field_0).field_0._31 +
       (a->field_0).field_0._23 * (b->field_0).field_0._32;
  (this->field_0).field_0._34 = 0.0;
  (this->field_0).field_0._41 =
       (a->field_0).field_0._31 * (b->field_0).field_0._43 +
       (a->field_0).field_0._11 * (b->field_0).field_0._41 +
       (a->field_0).field_0._21 * (b->field_0).field_0._42 + (a->field_0).field_0._41;
  (this->field_0).field_0._42 =
       (a->field_0).field_0._32 * (b->field_0).field_0._43 +
       (a->field_0).field_0._12 * (b->field_0).field_0._41 +
       (a->field_0).field_0._22 * (b->field_0).field_0._42 + (a->field_0).field_0._42;
  (this->field_0).field_0._43 =
       (a->field_0).field_0._33 * (b->field_0).field_0._43 +
       (a->field_0).field_0._13 * (b->field_0).field_0._41 +
       (a->field_0).field_0._23 * (b->field_0).field_0._42 + (a->field_0).field_0._43;
  (this->field_0).field_0._44 = 1.0;
  return this;
}

Assistant:

_matrix<T>& _matrix<T>::mul_43(const _matrix<T>& a, const _matrix<T>& b)
{
	assert(this != &a && this != &b);
	_11 = a._11*b._11 + a._21*b._12 + a._31*b._13;
	_12 = a._12*b._11 + a._22*b._12 + a._32*b._13;
	_13 = a._13*b._11 + a._23*b._12 + a._33*b._13;
	_14 = 0;

	_21 = a._11*b._21 + a._21*b._22 + a._31*b._23;
	_22 = a._12*b._21 + a._22*b._22 + a._32*b._23;
	_23 = a._13*b._21 + a._23*b._22 + a._33*b._23;
	_24 = 0;

	_31 = a._11*b._31 + a._21*b._32 + a._31*b._33;
	_32 = a._12*b._31 + a._22*b._32 + a._32*b._33;
	_33 = a._13*b._31 + a._23*b._32 + a._33*b._33;
	_34 = 0;

	_41 = a._11*b._41 + a._21*b._42 + a._31*b._43 + a._41;
	_42 = a._12*b._41 + a._22*b._42 + a._32*b._43 + a._42;
	_43 = a._13*b._41 + a._23*b._42 + a._33*b._43 + a._43;
	_44 = 1;

	return *this;
}